

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase726::~TestCase726(TestCase726 *this)

{
  TestCase726 *this_local;
  
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Async, RaceSuccessful) {
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = newPromiseAndFulfiller<int>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = newPromiseAndFulfiller<int>(); // never fulfilled
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; }).eagerlyEvaluate(nullptr);

    EXPECT_EQ(456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    KJ_EXPECT_THROW(FAILED, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    struct NoCopy {
      int i;

      NoCopy(int i) : i(i) {}
      NoCopy(const NoCopy&) = delete;

      NoCopy(NoCopy&&) = default;
      NoCopy& operator=(NoCopy&&) = default;
    };

    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([]() -> kj::Promise<NoCopy> { return NoCopy(123); });
    kj::PromiseFulfillerPair<NoCopy> right = newPromiseAndFulfiller<NoCopy>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope).i);
  }
}